

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuD3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuD3D6 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdEmuD3D6CombineControl *pMVar2;
  MthdEmuD3D56TexFilter *pMVar3;
  MthdEmuD3D56TexFormat *pMVar4;
  MthdEmuD3D56TexOffset *pMVar5;
  MthdCtxSurf3D *pMVar6;
  MthdDmaGrobj *pMVar7;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar8;
  SingleMthdTest *this_01;
  result_type rVar9;
  Test *pTVar10;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_679;
  undefined1 *local_678;
  long local_670;
  undefined1 local_668 [16];
  Test *local_658;
  Test *local_650;
  Test *local_648;
  Test *local_640;
  Test *local_638;
  Test *local_630;
  Test *local_628;
  Test *local_620;
  Test *local_618;
  Test *local_610;
  Test *local_608;
  Test *local_600;
  Test *local_5f8;
  MthdEmuD3D6CombineControl *local_5f0;
  MthdEmuD3D6CombineControl *local_5e8;
  MthdEmuD3D6CombineControl *local_5e0;
  MthdEmuD3D6CombineControl *local_5d8;
  MthdEmuD3D56TexFilter *local_5d0;
  MthdEmuD3D56TexFilter *local_5c8;
  MthdEmuD3D56TexFormat *local_5c0;
  MthdEmuD3D56TexFormat *local_5b8;
  MthdEmuD3D56TexOffset *local_5b0;
  MthdEmuD3D56TexOffset *local_5a8;
  MthdCtxSurf3D *local_5a0;
  MthdDmaGrobj *local_598;
  MthdDmaGrobj *local_590;
  Test *local_588;
  Test *local_580;
  Test *local_578;
  undefined1 *local_570;
  long local_568;
  undefined1 local_560 [16];
  undefined1 *local_550;
  long local_548;
  undefined1 local_540 [16];
  SingleMthdTest *local_530;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_528;
  undefined1 *local_520;
  long local_518;
  undefined1 local_510 [16];
  undefined1 *local_500;
  long local_4f8;
  undefined1 local_4f0 [16];
  undefined1 *local_4e0;
  long local_4d8;
  undefined1 local_4d0 [16];
  undefined1 *local_4c0;
  long local_4b8;
  undefined1 local_4b0 [16];
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490 [16];
  undefined1 *local_480;
  long local_478;
  undefined1 local_470 [16];
  undefined1 *local_460;
  long local_458;
  undefined1 local_450 [16];
  undefined1 *local_440;
  long local_438;
  undefined1 local_430 [16];
  undefined1 *local_420;
  long local_418;
  undefined1 local_410 [16];
  undefined1 *local_400;
  long local_3f8;
  undefined1 local_3f0 [16];
  undefined1 *local_3e0;
  long local_3d8;
  undefined1 local_3d0 [16];
  undefined1 *local_3c0;
  long local_3b8;
  undefined1 local_3b0 [16];
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390 [16];
  undefined1 *local_380;
  long local_378;
  undefined1 local_370 [16];
  undefined1 *local_360;
  long local_358;
  undefined1 local_350 [16];
  undefined1 *local_340;
  long local_338;
  undefined1 local_330 [16];
  undefined1 *local_320;
  long local_318;
  undefined1 local_310 [16];
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  SingleMthdTest *local_140;
  Test *local_138;
  Test *local_130;
  Test *local_128;
  MthdDmaGrobj *local_120;
  MthdDmaGrobj *local_118;
  MthdCtxSurf3D *local_110;
  MthdEmuD3D56TexOffset *local_108;
  MthdEmuD3D56TexOffset *local_100;
  MthdEmuD3D56TexFormat *local_f8;
  MthdEmuD3D56TexFormat *local_f0;
  MthdEmuD3D56TexFilter *local_e8;
  MthdEmuD3D56TexFilter *local_e0;
  MthdEmuD3D6CombineControl *local_d8;
  MthdEmuD3D6CombineControl *local_d0;
  MthdEmuD3D6CombineControl *local_c8;
  MthdEmuD3D6CombineControl *local_c0;
  Test *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_530 = this_01;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_570 = local_560;
  local_528 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar9);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_570,local_570 + local_568);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_140 = this_01;
  local_578 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_550 = local_540;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"notify","");
  pTVar10 = local_578;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_578,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_550,local_550 + local_548);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_138 = pTVar10;
  local_580 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_678 = local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"pm_trigger","");
  pTVar10 = local_580;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_580,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_678,local_678 + local_670);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_130 = pTVar10;
  local_588 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"dma_notify","");
  pTVar10 = local_588;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_588,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 1;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_300,local_300 + local_2f8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_128 = pTVar10;
  local_590 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"dma_tex_a","");
  pMVar7 = local_590;
  MthdDmaGrobj::MthdDmaGrobj
            (local_590,opt,(uint32_t)rVar9,&local_160,2,(this->super_Class).cls,0x184,0,4);
  local_120 = pMVar7;
  local_598 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"dma_tex_b","");
  pMVar7 = local_598;
  MthdDmaGrobj::MthdDmaGrobj
            (local_598,opt,(uint32_t)rVar9,&local_180,3,(this->super_Class).cls,0x188,1,4);
  local_118 = pMVar7;
  local_5a0 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"ctx_surf3d","");
  pMVar6 = local_5a0;
  uVar1 = (this->super_Class).cls;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_5a0,opt,(uint32_t)rVar9,&local_1a0,4,uVar1,0x18c,(uint)(uVar1 != 0x55));
  local_110 = pMVar6;
  local_5a8 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"tex_0_offset","");
  pMVar5 = local_5a8;
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (local_5a8,opt,(uint32_t)rVar9,&local_1c0,5,(this->super_Class).cls,0x308,1);
  local_108 = pMVar5;
  local_5b0 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"tex_1_offset","");
  pMVar5 = local_5b0;
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (local_5b0,opt,(uint32_t)rVar9,&local_1e0,6,(this->super_Class).cls,0x30c,2);
  local_100 = pMVar5;
  local_5b8 = (MthdEmuD3D56TexFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"tex_0_format","");
  pMVar4 = local_5b8;
  MthdEmuD3D56TexFormat::MthdEmuD3D56TexFormat
            (local_5b8,opt,(uint32_t)rVar9,&local_200,7,(this->super_Class).cls,0x310,1);
  local_f8 = pMVar4;
  local_5c0 = (MthdEmuD3D56TexFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"tex_1_format","");
  pMVar4 = local_5c0;
  MthdEmuD3D56TexFormat::MthdEmuD3D56TexFormat
            (local_5c0,opt,(uint32_t)rVar9,&local_220,8,(this->super_Class).cls,0x314,2);
  local_f0 = pMVar4;
  local_5c8 = (MthdEmuD3D56TexFilter *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"tex_0_filter","");
  pMVar3 = local_5c8;
  MthdEmuD3D56TexFilter::MthdEmuD3D56TexFilter
            (local_5c8,opt,(uint32_t)rVar9,&local_240,9,(this->super_Class).cls,0x318,1);
  local_e8 = pMVar3;
  local_5d0 = (MthdEmuD3D56TexFilter *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"tex_1_filter","");
  pMVar3 = local_5d0;
  MthdEmuD3D56TexFilter::MthdEmuD3D56TexFilter
            (local_5d0,opt,(uint32_t)rVar9,&local_260,10,(this->super_Class).cls,0x31c,2);
  local_e0 = pMVar3;
  local_5d8 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"combine_0_control_alpha","")
  ;
  pMVar2 = local_5d8;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_5d8,opt,(uint32_t)rVar9,&local_280,0xb,(this->super_Class).cls,800,0,0);
  local_d8 = pMVar2;
  local_5e0 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"combine_0_control_color","")
  ;
  pMVar2 = local_5e0;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_5e0,opt,(uint32_t)rVar9,&local_2a0,0xc,(this->super_Class).cls,0x324,0,1);
  local_d0 = pMVar2;
  local_5e8 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"combine_1_control_alpha","")
  ;
  pMVar2 = local_5e8;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_5e8,opt,(uint32_t)rVar9,&local_2c0,0xd,(this->super_Class).cls,0x32c,1,0);
  local_c8 = pMVar2;
  local_5f0 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"combine_1_control_color","")
  ;
  pMVar2 = local_5f0;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_5f0,opt,(uint32_t)rVar9,&local_2e0,0xe,(this->super_Class).cls,0x330,1,1);
  local_c0 = pMVar2;
  local_5f8 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"combine_factor","");
  pTVar10 = local_5f8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_5f8,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x334;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_320,local_320 + local_318);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a1c0;
  local_b8 = pTVar10;
  local_600 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"blend","");
  pTVar10 = local_600;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_600,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x338;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_340,local_340 + local_338);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359de0;
  local_b0 = pTVar10;
  local_608 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"config","");
  pTVar10 = local_608;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_608,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x33c;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_360,local_360 + local_358);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359ed8;
  local_a8 = pTVar10;
  local_610 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"stencil_func","");
  pTVar10 = local_610;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_610,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x340;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x12;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_380,local_380 + local_378);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a2b8;
  local_a0 = pTVar10;
  local_618 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"stencil_op","");
  pTVar10 = local_618;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_618,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x344;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x13;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_3a0,local_3a0 + local_398);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a3b0;
  local_98 = pTVar10;
  local_620 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"fog_color","");
  pTVar10 = local_620;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_620,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x348;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x14;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_3c0,local_3c0 + local_3b8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359148;
  local_90 = pTVar10;
  local_628 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"tlv_x","");
  pTVar10 = local_628;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_628,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x15;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_3e0,local_3e0 + local_3d8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359620;
  local_88 = pTVar10;
  local_630 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"tlv_y","");
  pTVar10 = local_630;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_630,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x16;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_400,local_400 + local_3f8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359718;
  local_80 = pTVar10;
  local_638 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_420 = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"tlv_z","");
  pTVar10 = local_638;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_638,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x408;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x17;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_420,local_420 + local_418);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359810;
  local_78 = pTVar10;
  local_640 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_440 = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"tlv_rhw","");
  pTVar10 = local_640;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_640,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x40c;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x18;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_440,local_440 + local_438);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359908;
  local_70 = pTVar10;
  local_648 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_460 = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"tlv_color","");
  pTVar10 = local_648;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_648,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x410;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x19;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_460,local_460 + local_458);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359528;
  local_68 = pTVar10;
  local_650 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"tlv_fog_col1","");
  pTVar10 = local_650;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_650,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x414;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x1a;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_480,local_480 + local_478);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359fd0;
  local_60 = pTVar10;
  local_658 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"tlv_u_0","");
  pTVar10 = local_658;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_658,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x418;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x1b;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_4a0,local_4a0 + local_498);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a00;
  pTVar10[0x1e].rnd._M_x[0x119] = 0;
  *(undefined1 *)(pTVar10[0x1e].rnd._M_x + 0x11a) = 0;
  local_58 = pTVar10;
  pTVar10 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"tlv_v_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar10,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x41c;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x1c;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_4c0,local_4c0 + local_4b8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a00;
  pTVar10[0x1e].rnd._M_x[0x119] = 1;
  *(undefined1 *)(pTVar10[0x1e].rnd._M_x + 0x11a) = 0;
  local_50 = pTVar10;
  pTVar10 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"tlv_u_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar10,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x420;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x1d;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_4e0,local_4e0 + local_4d8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a00;
  pTVar10[0x1e].rnd._M_x[0x119] = 0x100000000;
  *(undefined1 *)(pTVar10[0x1e].rnd._M_x + 0x11a) = 0;
  local_48 = pTVar10;
  pTVar10 = (Test *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_500 = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"tlv_v_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar10,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x424;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x1e;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_500,local_500 + local_4f8);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a00;
  pTVar10[0x1e].rnd._M_x[0x119] = 0x100000001;
  *(undefined1 *)(pTVar10[0x1e].rnd._M_x + 0x11a) = 1;
  local_40 = pTVar10;
  pTVar10 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_520 = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"draw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar10,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x540;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 0x30;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0x1f;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_520,local_520 + local_518);
  pvVar8 = local_528;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034d010;
  __l._M_len = 0x22;
  __l._M_array = &local_140;
  local_38 = pTVar10;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_528,__l,&local_679);
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  if (local_460 != local_450) {
    operator_delete(local_460);
  }
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_678 != local_668) {
    operator_delete(local_678);
  }
  if (local_550 != local_540) {
    operator_delete(local_550);
  }
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  return pvVar8;
}

Assistant:

std::vector<SingleMthdTest *> EmuD3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", 3, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", 4, cls, 0x18c, cls == 0x55 ? SURF2D_NV4 : SURF2D_NV10),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_0_offset", 5, cls, 0x308, 1),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_1_offset", 6, cls, 0x30c, 2),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_0_format", 7, cls, 0x310, 1),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_1_format", 8, cls, 0x314, 2),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_0_filter", 9, cls, 0x318, 1),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_1_filter", 10, cls, 0x31c, 2),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", 11, cls, 0x320, 0, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_color", 12, cls, 0x324, 0, 1),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", 13, cls, 0x32c, 1, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_color", 14, cls, 0x330, 1, 1),
		new MthdEmuD3D6CombineFactor(opt, rnd(), "combine_factor", 15, cls, 0x334),
		new MthdEmuD3D56Blend(opt, rnd(), "blend", 16, cls, 0x338),
		new MthdEmuD3D56Config(opt, rnd(), "config", 17, cls, 0x33c),
		new MthdEmuD3D6StencilFunc(opt, rnd(), "stencil_func", 18, cls, 0x340),
		new MthdEmuD3D6StencilOp(opt, rnd(), "stencil_op", 19, cls, 0x344),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 20, cls, 0x348),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 21, cls, 0x400, 8, 0x28),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 22, cls, 0x404, 8, 0x28),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 23, cls, 0x408, 8, 0x28),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 24, cls, 0x40c, 8, 0x28),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 25, cls, 0x410, 8, 0x28),
		new MthdEmuD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", 26, cls, 0x414, 8, 0x28),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_0", 27, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_0", 28, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_1", 29, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_1", 30, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", 31, cls, 0x540, 0x30),
	};
}